

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId_00;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar4;
  undefined4 *puVar5;
  PropertyRecord *pPropertyName;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data_local;
  OpCode op_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId_00 = FunctionBody::GetPropertyIdFromCacheId(dumpFunction,(uint)data->inlineCacheIndex);
  this_00 = ScriptContext::GetPropertyName(this,propertyId_00);
  if (op == LdLocalFld) {
LAB_00b20f39:
    bVar1 = data->Value;
    pcVar4 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = %s #%d",(ulong)bVar1,pcVar4,(ulong)data->inlineCacheIndex);
  }
  else {
    if (op != ProfiledLdLocalFld) {
      if (op == LdLocalFld_ReuseLoc) goto LAB_00b20f39;
      if (op != ProfiledLdLocalFld_ReuseLoc) {
        if (op != StLocalFld) {
          if (op != ProfiledStLocalFld) {
            if (op == InitLocalFld) goto LAB_00b20fae;
            if (op != ProfiledInitLocalFld) {
              if (op != ScopedLdFld) {
                if (1 < (ushort)(op - ScopedStFld)) {
                  if (((op == InitUndeclLocalLetFld) || (op == InitUndeclLocalConstFld)) ||
                     (op == InitLocalLetFld)) goto LAB_00b20fae;
                  if (op == ScopedLdFldForTypeOf) goto LAB_00b20ecb;
                  if (1 < (ushort)(op - ConsoleScopedStFld)) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar5 = 1;
                    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                                ,0x401,"(false)",
                                                "Unknown OpCode for OpLayoutElementP");
                    if (bVar3) {
                      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar5 = 0;
                      return;
                    }
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                }
                pcVar4 = PropertyRecord::GetBuffer(this_00);
                Output::Print(L" %s = R%d, R%d #%d",pcVar4,(ulong)data->Value,1,
                              (ulong)data->inlineCacheIndex);
                return;
              }
LAB_00b20ecb:
              bVar1 = data->Value;
              pcVar4 = PropertyRecord::GetBuffer(this_00);
              Output::Print(L" R%d = %s, R%d #%d",(ulong)bVar1,pcVar4,1,
                            (ulong)data->inlineCacheIndex);
              return;
            }
          }
          pcVar4 = PropertyRecord::GetBuffer(this_00);
          Output::Print(L" %s = R%d #%d",pcVar4,(ulong)data->Value,(ulong)data->inlineCacheIndex);
          DumpProfileId((uint)data->inlineCacheIndex);
          return;
        }
LAB_00b20fae:
        pcVar4 = PropertyRecord::GetBuffer(this_00);
        Output::Print(L" %s = R%d #%d",pcVar4,(ulong)data->Value,(ulong)data->inlineCacheIndex);
        return;
      }
    }
    bVar1 = data->Value;
    pcVar4 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d = %s #%d",(ulong)bVar1,pcVar4,(ulong)data->inlineCacheIndex);
    DumpProfileId((uint)data->inlineCacheIndex);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementP(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyId propertyId = dumpFunction->GetPropertyIdFromCacheId(data->inlineCacheIndex);
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propertyId);
        switch (op)
        {
            case OpCode::ScopedLdFldForTypeOf:
            case OpCode::ScopedLdFld:
                Output::Print(_u(" R%d = %s, R%d #%d"), data->Value, pPropertyName->GetBuffer(),
                    Js::FunctionBody::RootObjectRegSlot, data->inlineCacheIndex);
                break;

            case OpCode::ScopedStFld:
            case OpCode::ConsoleScopedStFld:
            case OpCode::ScopedStFldStrict:
            case OpCode::ConsoleScopedStFldStrict:
                Output::Print(_u(" %s = R%d, R%d #%d"), pPropertyName->GetBuffer(), data->Value,
                    Js::FunctionBody::RootObjectRegSlot, data->inlineCacheIndex);
                break;

            case OpCode::LdLocalFld:
            case OpCode::LdLocalFld_ReuseLoc:
                Output::Print(_u(" R%d = %s #%d"), data->Value, pPropertyName->GetBuffer(), data->inlineCacheIndex);
                break;

            case OpCode::ProfiledLdLocalFld:
            case OpCode::ProfiledLdLocalFld_ReuseLoc:
                Output::Print(_u(" R%d = %s #%d"), data->Value, pPropertyName->GetBuffer(), data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;

            case OpCode::StLocalFld:
            case OpCode::InitLocalFld:
            case OpCode::InitLocalLetFld:
            case OpCode::InitUndeclLocalLetFld:
            case OpCode::InitUndeclLocalConstFld:
                Output::Print(_u(" %s = R%d #%d"), pPropertyName->GetBuffer(), data->Value, data->inlineCacheIndex);
                break;

            case OpCode::ProfiledStLocalFld:
            case OpCode::ProfiledInitLocalFld:
                Output::Print(_u(" %s = R%d #%d"), pPropertyName->GetBuffer(), data->Value, data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;

            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementP");
                break;
            }
        }
    }